

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::long_apply_2_test::~long_apply_2_test(long_apply_2_test *this)

{
  long_apply_2_test *this_local;
  
  compile_fixture_skiwi::~compile_fixture_skiwi((compile_fixture_skiwi *)this);
  return;
}

Assistant:

void test()
      {
      build_srfi1();
      TEST_EQ("210", run("(%apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("210", run("(apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("<lambda>", run("(define (rms nums) (sqrt (/ (apply + (map * nums nums))(length nums))))"));
      TEST_EQ("11.9791", run("(rms (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("(define dm (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      TEST_EQ("11.9791", run("(rms dm)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      TEST_EQ("(0 1 2 3 4)", run("(iota 5)"));
      TEST_EQ("2000", run("(define dm (iota 2000)) (length dm)"));
      TEST_EQ("1999000", run("(apply + dm)"));
      TEST_EQ("2000", run("(length dm)"));
      }